

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<char16_t,std::allocator<char16_t>>,void>
               (vector<char16_t,_std::allocator<char16_t>_> *container,ostream *os)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pcVar4;
  long lVar5;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  pcVar1 = (container->super__Vector_base<char16_t,_std::allocator<char16_t>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (container->super__Vector_base<char16_t,_std::allocator<char16_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar1 != pcVar2) {
    lVar5 = 0;
    do {
      pcVar4 = pcVar1 + 1;
      if (lVar5 == 0) {
LAB_00333b69:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        testing::internal::PrintTo((uint)(ushort)*pcVar1,os);
        lVar5 = lVar5 + 1;
        bVar3 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar5 != 0x20) goto LAB_00333b69;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar5 = 0x20;
        bVar3 = true;
      }
    } while ((!bVar3) && (pcVar1 = pcVar4, pcVar4 != pcVar2));
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }